

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

FeatureDescriptor * __thiscall
cmComputeLinkInformation::FindLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  const_iterator cVar1;
  FeatureDescriptor *pFVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&(this->LibraryFeatureDescriptors)._M_t,feature);
  pFVar2 = (FeatureDescriptor *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    pFVar2 = (FeatureDescriptor *)(cVar1._M_node + 2);
  }
  return pFVar2;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const*
cmComputeLinkInformation::FindLibraryFeature(std::string const& feature) const
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it == this->LibraryFeatureDescriptors.end()) {
    return nullptr;
  }

  return &it->second;
}